

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_mod(jit_State *J,TRef rb,TRef rc,TValue *vb,TValue *vc)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  
  TVar1 = conv_str_tonum(J,rb,vb);
  TVar2 = conv_str_tonum(J,rc,vc);
  if (((((J->flags & 0x200000) == 0) || (4 < (TVar1 >> 0x18 & 0x1f) - 0xf)) ||
      (4 < (TVar2 >> 0x18 & 0x1f) - 0xf)) || ((vc->u64 & 0x7fffffffffffffff) == 0)) {
    TVar1 = lj_ir_tonum(J,TVar1);
    TVar2 = lj_ir_tonum(J,TVar2);
    (J->fold).ins.field_0.ot = 0x2c0e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x340e0000;
    TVar3 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2b0e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2a0e;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  }
  else {
    TVar3 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x993;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2d13;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  }
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

TRef lj_opt_narrow_mod(jit_State *J, TRef rb, TRef rc, TValue *vb, TValue *vc)
{
  TRef tmp;
  rb = conv_str_tonum(J, rb, vb);
  rc = conv_str_tonum(J, rc, vc);
  if ((LJ_DUALNUM || (J->flags & JIT_F_OPT_NARROW)) &&
      tref_isinteger(rb) && tref_isinteger(rc) &&
      (tvisint(vc) ? intV(vc) != 0 : !tviszero(vc))) {
    emitir(IRTGI(IR_NE), rc, lj_ir_kint(J, 0));
    return emitir(IRTI(IR_MOD), rb, rc);
  }
  /* b % c ==> b - floor(b/c)*c */
  rb = lj_ir_tonum(J, rb);
  rc = lj_ir_tonum(J, rc);
  tmp = emitir(IRTN(IR_DIV), rb, rc);
  tmp = emitir(IRTN(IR_FPMATH), tmp, IRFPM_FLOOR);
  tmp = emitir(IRTN(IR_MUL), tmp, rc);
  return emitir(IRTN(IR_SUB), rb, tmp);
}